

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitFactor.c
# Opt level: O3

Kit_Edge_t Kit_SopFactorTrivialCube_rec(Kit_Graph_t *pFForm,uint uCube,int nStart,int nFinish)

{
  uint uVar1;
  Kit_Edge_t KVar2;
  Kit_Edge_t eEdge1;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  
  if (uCube == 0) {
    __assert_fail("uCube",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitFactor.c"
                  ,0xcb,
                  "Kit_Edge_t Kit_SopFactorTrivialCube_rec(Kit_Graph_t *, unsigned int, int, int)");
  }
  if (nStart < nFinish) {
    uVar1 = 0;
    uVar4 = 0xffffffff;
    uVar5 = nStart;
    do {
      uVar1 = uVar1 + ((uCube >> (uVar5 & 0x1f) & 1) != 0);
      if ((uCube >> (uVar5 & 0x1f) & 1) != 0) {
        uVar4 = (ulong)uVar5;
      }
      uVar5 = uVar5 + 1;
    } while (nFinish != uVar5);
    uVar5 = (uint)uVar4;
    if (uVar5 != 0xffffffff) {
      if (uVar1 == 1) {
        return (Kit_Edge_t)((int)(uVar4 >> 0x1f) + uVar5 & 0x7ffffffe | uVar5 & 1);
      }
      uVar5 = nStart;
      if (nStart < nFinish) {
        uVar3 = 0;
        uVar6 = nStart;
        do {
          uVar5 = uVar6;
          if ((uCube >> (uVar5 & 0x1f) & 1) != 0) {
            if (uVar3 == uVar1 >> 1) break;
            uVar3 = uVar3 + 1;
          }
          uVar6 = uVar5 + 1;
          uVar5 = nFinish;
        } while (nFinish != uVar6);
      }
      KVar2 = Kit_SopFactorTrivialCube_rec(pFForm,uCube,nStart,uVar5);
      eEdge1 = Kit_SopFactorTrivialCube_rec(pFForm,uCube,uVar5,nFinish);
      KVar2 = Kit_GraphAddNodeAnd(pFForm,KVar2,eEdge1);
      return KVar2;
    }
  }
  __assert_fail("iLit != -1",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitFactor.c"
                ,0xd4,
                "Kit_Edge_t Kit_SopFactorTrivialCube_rec(Kit_Graph_t *, unsigned int, int, int)");
}

Assistant:

Kit_Edge_t Kit_SopFactorTrivialCube_rec( Kit_Graph_t * pFForm, unsigned uCube, int nStart, int nFinish )
{
    Kit_Edge_t eNode1, eNode2;
    int i, iLit = -1, nLits, nLits1, nLits2;
    assert( uCube );
    // count the number of literals in this interval
    nLits = 0;
    for ( i = nStart; i < nFinish; i++ )
        if ( Kit_CubeHasLit(uCube, i) )
        {
            iLit = i;
            nLits++;
        }
    assert( iLit != -1 );
    // quit if there is only one literal        
    if ( nLits == 1 )
        return Kit_EdgeCreate( iLit/2, iLit%2 ); // CST
    // split the literals into two parts
    nLits1 = nLits/2;
    nLits2 = nLits - nLits1;
//    nLits2 = nLits/2;
//    nLits1 = nLits - nLits2;
    // find the splitting point
    nLits = 0;
    for ( i = nStart; i < nFinish; i++ )
        if ( Kit_CubeHasLit(uCube, i) )
        {
            if ( nLits == nLits1 )
                break;
            nLits++;
        }
    // recursively construct the tree for the parts
    eNode1 = Kit_SopFactorTrivialCube_rec( pFForm, uCube, nStart, i  );
    eNode2 = Kit_SopFactorTrivialCube_rec( pFForm, uCube, i, nFinish );
    return Kit_GraphAddNodeAnd( pFForm, eNode1, eNode2 );
}